

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ReservoirQuantileBindData::Deserialize
          (Deserializer *deserializer,AggregateFunction *function)

{
  pointer pRVar1;
  unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>_>
  *in_RSI;
  FunctionData *in_RDI;
  templated_unique_single_t result;
  unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
  *in_stack_ffffffffffffffa0;
  field_id_t field_id;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  vector<double,_true> *ret;
  unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>_>
  *tag;
  Deserializer *in_stack_ffffffffffffffd0;
  vector<double,_true> local_20;
  
  ret = &local_20;
  this._M_head_impl = in_RDI;
  local_20.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_RSI;
  make_uniq<duckdb::ReservoirQuantileBindData>();
  field_id = (field_id_t)((ulong)in_RDI >> 0x30);
  tag = (unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>_>
         *)local_20.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pRVar1 = unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
           ::operator->(in_stack_ffffffffffffffa0);
  Deserializer::ReadProperty<duckdb::vector<double,true>>
            (in_stack_ffffffffffffffd0,(field_id_t)((ulong)pRVar1 >> 0x30),(char *)tag,ret);
  pRVar1 = unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
           ::operator->(in_stack_ffffffffffffffa0);
  Deserializer::ReadProperty<unsigned_long>
            ((Deserializer *)this._M_head_impl,field_id,(char *)pRVar1,
             (unsigned_long *)
             local_20.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::ReservoirQuantileBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             pRVar1,(unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>_>
                     *)local_20.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
                 *)0x9cc76e);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &function) {
		auto result = make_uniq<ReservoirQuantileBindData>();
		deserializer.ReadProperty(100, "quantiles", result->quantiles);
		deserializer.ReadProperty(101, "sample_size", result->sample_size);
		return std::move(result);
	}